

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChDampingReissner::ComputeDampingMatrix
          (ChDampingReissner *this,ChMatrixRef *R,ChVector<double> *deps_u,ChVector<double> *deps_v,
          ChVector<double> *dkur_u,ChVector<double> *dkur_v,double z_inf,double z_sup,double angle)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ChMatrixRef *pCVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ActualDstType actualDst;
  long lVar11;
  uint uVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  Index alignedStart_1;
  Index alignedEnd;
  SrcEvaluatorType srcEvaluator;
  ChVector<double> nu;
  Index alignedStart_2;
  ChVector<double> mv;
  ChVector<double> mu;
  ChVector<double> nv;
  ChVectorN<double,_12> dstrain_0;
  ChVectorN<double,_12> stress_0;
  ChVector<double> ddkur_u;
  ChVector<double> ddeps_v;
  ChVector<double> ddeps_u;
  ChVectorN<double,_12> stress_d;
  ChVector<double> ddkur_v;
  SrcEvaluatorType local_380;
  undefined8 uStack_370;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *pgStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_310 [16];
  undefined8 local_300;
  undefined1 *local_2f0;
  void *local_2e8;
  undefined1 *local_2e0;
  void *local_2d8;
  undefined1 *local_2d0;
  SrcEvaluatorType *local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  size_t local_2b0;
  undefined8 local_2a8;
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  ChMatrixRef *local_288;
  undefined1 local_280 [16];
  undefined8 local_270;
  undefined1 local_260 [16];
  undefined8 local_250;
  undefined1 local_240 [16];
  undefined8 local_230;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_220;
  undefined1 local_1f0 [24];
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  DstEvaluatorType local_1c0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  SrcEvaluatorType *local_148;
  ChVector<double> local_128;
  ChVector<double> local_110;
  ChVector<double> local_f8;
  double local_e0 [14];
  ChVector<double> local_70 [2];
  
  if ((R->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value != 0xc) {
    __assert_fail("R.rows() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellReissner.cpp"
                  ,0x248,
                  "virtual void chrono::fea::ChDampingReissner::ComputeDampingMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
                 );
  }
  if ((R->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 0xc) {
    local_220.m_src = &local_380;
    local_220.m_dst = &local_1c0;
    local_380.m_functor.m_other = 0.0;
    local_1c0.
    super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_data = (R->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_data;
    local_1c0.
    super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_outerStride.m_value =
         (R->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).m_stride.m_outer.m_value;
    local_220.m_functor = (assign_op<double,_double> *)local_e0;
    local_220.m_dstExpr = R;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run(&local_220);
    uVar9 = -((uint)((ulong)&local_220 >> 3) & 0x1fffffff) & 4;
    uVar12 = 3;
    if (uVar9 < 3) {
      uVar12 = uVar9;
    }
    if (uVar9 != 0) {
      local_220.m_functor = (assign_op<double,_double> *)deps_u->m_data[2];
      local_220.m_dst = (DstEvaluatorType *)deps_u->m_data[0];
      local_220.m_src = (SrcEvaluatorType *)deps_u->m_data[1];
    }
    if (uVar12 != 3) {
      uVar8 = (ulong)(uVar12 << 3);
      memcpy((void *)((long)&local_220.m_dst + uVar8),(void *)((long)deps_u->m_data + uVar8),
             0x18 - uVar8);
    }
    uVar12 = -((uint)((ulong)&local_220.m_dstExpr >> 3) & 0x1fffffff) & 5;
    if (2 < uVar12) {
      uVar12 = 3;
    }
    uVar8 = (ulong)(uVar12 * 8);
    memcpy(&local_220.m_dstExpr,deps_v,uVar8);
    if (uVar12 != 3) {
      memcpy((void *)((long)&local_220.m_dstExpr + uVar8),(void *)((long)deps_v->m_data + uVar8),
             0x18 - uVar8);
    }
    uVar9 = -((uint)((ulong)local_1f0 >> 3) & 0x1fffffff) & 6;
    uVar12 = 3;
    if (uVar9 < 3) {
      uVar12 = uVar9;
    }
    uVar8 = (ulong)(uVar12 * 8);
    memcpy(local_1f0,dkur_u,uVar8);
    if (uVar12 != 3) {
      memcpy(local_1f0 + uVar8,(void *)((long)dkur_u->m_data + uVar8),0x18 - uVar8);
    }
    local_1c8 = dkur_v->m_data[2];
    local_1d8 = dkur_v->m_data[0];
    dStack_1d0 = dkur_v->m_data[1];
    local_300 = 0;
    local_230 = 0;
    local_250 = 0;
    local_270 = 0;
    local_310 = ZEXT816(0) << 0x20;
    local_280 = local_310;
    local_260 = local_310;
    local_240 = local_310;
    (*this->_vptr_ChDampingReissner[2])(z_inf,z_sup,angle);
    memcpy(&local_1c0,local_310,0x18);
    uVar12 = -((uint)((ulong)&uStack_1a8 >> 3) & 0x1fffffff) & 5;
    if (2 < uVar12) {
      uVar12 = 3;
    }
    uVar8 = (ulong)(uVar12 * 8);
    memcpy(&uStack_1a8,local_240,uVar8);
    if (uVar12 != 3) {
      memcpy(local_1a0 + (uVar8 - 8),local_240 + uVar8,0x18 - uVar8);
    }
    uVar9 = -((uint)((ulong)(local_1a0 + 0x10) >> 3) & 0x1fffffff) & 6;
    uVar12 = 3;
    if (uVar9 < 3) {
      uVar12 = uVar9;
    }
    uVar8 = (ulong)(uVar12 * 8);
    memcpy(local_1a0 + 0x10,local_260,uVar8);
    if (uVar12 != 3) {
      memcpy(local_1a0 + uVar8 + 0x10,local_260 + uVar8,0x18 - uVar8);
    }
    uStack_168 = local_270;
    uStack_178 = local_280._0_8_;
    uStack_170 = local_280._8_8_;
    uVar12 = -((uint)((ulong)&pgStack_368 >> 3) & 0x1fffffff) & 5;
    if (2 < uVar12) {
      uVar12 = 3;
    }
    local_298 = (ulong)(uVar12 * 8);
    local_290 = (ulong)(-((uint)((ulong)&uStack_350 >> 3) & 0x1fffffff) & 6);
    if (2 < local_290) {
      local_290 = 3;
    }
    local_2a8 = 0;
    local_2b8 = local_298 ^ 0x18;
    lVar11 = 0;
    local_2b0 = 0x18;
    local_2c8 = &local_380;
    local_2d0 = local_310;
    local_2a0 = (ulong)(uint)((int)local_290 * 8);
    local_2c0 = local_2a0 ^ 0x18;
    local_2f0 = local_260 + local_2a0;
    local_2d8 = (void *)((long)&pgStack_368 + local_298);
    local_2e0 = local_240 + local_298;
    local_2e8 = (void *)((long)&uStack_350 + local_2a0);
    local_288 = R;
    while( true ) {
      local_380._8_8_ = 3;
      local_360 = 0;
      uStack_350 = 0xc;
      (&local_220.m_dst)[lVar11] = (DstEvaluatorType *)((double)(&local_220.m_dst)[lVar11] + 1e-09);
      local_380.m_functor.m_other = (double)&local_220;
      pgStack_368 = &local_220;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_f8,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_380,(type *)0x0);
      local_380.m_functor.m_other = (double)&local_220.m_dstExpr;
      local_380._8_8_ = 3;
      local_360 = 3;
      uStack_350 = 0xc;
      pgStack_368 = &local_220;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_110,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_380,(type *)0x0);
      local_380.m_functor.m_other = (double)local_1f0;
      local_380._8_8_ = 3;
      local_360 = 6;
      uStack_350 = 0xc;
      pgStack_368 = &local_220;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_128,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_380,(type *)0x0);
      local_380.m_functor.m_other = (double)&local_1d8;
      local_380._8_8_ = 3;
      local_360 = 9;
      uStack_350 = 0xc;
      pgStack_368 = &local_220;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (local_70,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_>
                           *)&local_380,(type *)0x0);
      (*this->_vptr_ChDampingReissner[2])
                (z_inf,z_sup,angle,this,local_310,local_240,local_260,local_280,&local_f8,&local_110
                 ,&local_128,local_70);
      memcpy(local_2c8,local_2d0,local_2b0);
      memcpy(&pgStack_368,local_240,local_298);
      pCVar7 = local_288;
      if (uVar12 != 3) {
        memcpy(local_2d8,local_2e0,local_2b8);
      }
      memcpy(&uStack_350,local_260,local_2a0);
      if ((int)local_290 != 3) {
        memcpy(local_2e8,local_2f0,local_2c0);
      }
      uStack_328 = local_270;
      local_160 = 0x41cdcd64ffffffff;
      local_148 = &local_380;
      uStack_338 = local_280._0_8_;
      uStack_330 = local_280._8_8_;
      auVar2._8_8_ = local_380._8_8_;
      auVar2._0_8_ = local_380.m_functor.m_other;
      auVar2._16_8_ = uStack_370;
      auVar2._24_8_ = pgStack_368;
      auVar3._8_8_ = uStack_358;
      auVar3._0_8_ = local_360;
      auVar3._16_8_ = uStack_350;
      auVar3._24_8_ = uStack_348;
      auVar4._8_8_ = local_280._0_8_;
      auVar4._0_8_ = local_340;
      auVar4._16_8_ = local_280._8_8_;
      auVar4._24_8_ = local_270;
      auVar5._8_8_ = local_1c0.
                     super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                     ._8_8_;
      auVar5._0_8_ = local_1c0.
                     super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                     .m_data;
      auVar5._16_8_ =
           local_1c0.
           super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
           .m_outerStride.m_value;
      auVar5._24_8_ = uStack_1a8;
      auVar2 = vsubpd_avx(auVar2,auVar5);
      local_e0[0] = auVar2._0_8_ * 999999999.9999999;
      local_e0[1] = auVar2._8_8_ * 999999999.9999999;
      local_e0[2] = auVar2._16_8_ * 999999999.9999999;
      local_e0[3] = auVar2._24_8_ * 999999999.9999999;
      auVar2 = vsubpd_avx(auVar3,local_1a0);
      auVar6._8_8_ = uStack_178;
      auVar6._0_8_ = local_180;
      auVar6._16_8_ = uStack_170;
      auVar6._24_8_ = uStack_168;
      auVar3 = vsubpd_avx(auVar4,auVar6);
      local_e0[4] = auVar2._0_8_ * 999999999.9999999;
      local_e0[5] = auVar2._8_8_ * 999999999.9999999;
      local_e0[6] = auVar2._16_8_ * 999999999.9999999;
      local_e0[7] = auVar2._24_8_ * 999999999.9999999;
      local_e0[8] = auVar3._0_8_ * 999999999.9999999;
      local_e0[9] = auVar3._8_8_ * 999999999.9999999;
      local_e0[10] = auVar3._16_8_ * 999999999.9999999;
      local_e0[0xb] = auVar3._24_8_ * 999999999.9999999;
      if (((pCVar7->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < 0xc) ||
         ((pCVar7->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar11)) break;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (pCVar7->
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                     ).m_stride.m_outer.m_value;
      auVar13 = vpbroadcastq_avx512f(auVar1);
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar15 = vpbroadcastq_avx512f(ZEXT816(0xc));
      auVar16 = vpbroadcastq_avx512f(ZEXT816(8));
      lVar10 = 0;
      do {
        uVar8 = vpcmpuq_avx512f(auVar14,auVar15,1);
        auVar17 = vpmullq_avx512dq(auVar14,auVar13);
        auVar14 = vpaddq_avx512f(auVar14,auVar16);
        auVar18._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * (long)local_e0[lVar10 + 1];
        auVar18._0_8_ = (ulong)((byte)uVar8 & 1) * (long)local_e0[lVar10];
        auVar18._16_8_ = (ulong)((byte)(uVar8 >> 2) & 1) * (long)local_e0[lVar10 + 2];
        auVar18._24_8_ = (ulong)((byte)(uVar8 >> 3) & 1) * (long)local_e0[lVar10 + 3];
        auVar18._32_8_ = (ulong)((byte)(uVar8 >> 4) & 1) * (long)local_e0[lVar10 + 4];
        auVar18._40_8_ = (ulong)((byte)(uVar8 >> 5) & 1) * (long)local_e0[lVar10 + 5];
        auVar18._48_8_ = (ulong)((byte)(uVar8 >> 6) & 1) * (long)local_e0[lVar10 + 6];
        auVar18._56_8_ = (uVar8 >> 7) * (long)local_e0[lVar10 + 7];
        lVar10 = lVar10 + 8;
        vscatterqpd_avx512f(ZEXT864((pCVar7->
                                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                    ).
                                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                    .
                                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                    .m_data + lVar11) + auVar17 * (undefined1  [64])0x8,uVar8,
                            auVar18);
      } while (lVar10 != 0x10);
      (&local_220.m_dst)[lVar11] = (DstEvaluatorType *)((double)(&local_220.m_dst)[lVar11] + -1e-09)
      ;
      lVar11 = lVar11 + 1;
      if (lVar11 == 0xc) {
        return;
      }
    }
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  __assert_fail("R.cols() == 12",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellReissner.cpp"
                ,0x249,
                "virtual void chrono::fea::ChDampingReissner::ComputeDampingMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
               );
}

Assistant:

void ChDampingReissner::ComputeDampingMatrix(
    ChMatrixRef R,             // 12x12 material damping matrix values here
    const ChVector<>& deps_u,  // time derivative of strains along \e u direction
    const ChVector<>& deps_v,  // time derivative of strains along \e v direction
    const ChVector<>& dkur_u,  // time derivative of curvature along \e u direction
    const ChVector<>& dkur_v,  // time derivative of curvature along \e v direction
    const double z_inf,        // layer lower z value (along thickness coord)
    const double z_sup,        // layer upper z value (along thickness coord)
    const double angle         // layer angle respect to x (if needed) -not used in this, isotropic+
) {
    assert(R.rows() == 12);
    assert(R.cols() == 12);

    R.setZero();

    ChVectorN<double, 12> dstrain_0;
    dstrain_0.segment(0, 3) = deps_u.eigen();
    dstrain_0.segment(3, 3) = deps_v.eigen();
    dstrain_0.segment(6, 3) = dkur_u.eigen();
    dstrain_0.segment(9, 3) = dkur_v.eigen();

    ChVector<> nu, nv, mu, mv;
    this->ComputeStress(nu, nv, mu, mv, deps_u, deps_v, dkur_u, dkur_v, z_inf, z_sup, angle);

    ChVectorN<double, 12> stress_0;
    stress_0.segment(0,3) = nu.eigen();
    stress_0.segment(3,3) = nv.eigen();
    stress_0.segment(6,3) = mu.eigen();
    stress_0.segment(9,3) = mv.eigen();

    double delta = 1e-9;
    for (int i = 0; i < 12; ++i) {
        dstrain_0(i, 0) += delta;
        ChVector<> ddeps_u(dstrain_0.segment(0, 3));
        ChVector<> ddeps_v(dstrain_0.segment(3, 3));
        ChVector<> ddkur_u(dstrain_0.segment(6, 3));
        ChVector<> ddkur_v(dstrain_0.segment(9, 3));
        this->ComputeStress(nu, nv, mu, mv, ddeps_u, ddeps_v, ddkur_u, ddkur_v, z_inf, z_sup, angle);
        ChVectorN<double, 12> stress_1;
        stress_1.segment(0,3) = nu.eigen();
        stress_1.segment(3,3) = nv.eigen();
        stress_1.segment(6,3) = mu.eigen();
        stress_1.segment(9,3) = mv.eigen();
        ChVectorN<double, 12> stress_d = (1. / delta) * (stress_1 - stress_0);
        R.block(0, i, 12, 1) = stress_d;
        dstrain_0(i, 0) -= delta;
    }
}